

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_548f58::SQLiteBuildDB::dump(SQLiteBuildDB *this,raw_ostream *os)

{
  int iVar1;
  long lVar2;
  longlong lVar3;
  raw_ostream *prVar4;
  longlong N;
  longlong N_00;
  size_t in_RCX;
  int __oflag;
  pthread_mutex_t *__mutex;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef Str_08;
  sqlite3_stmt *stmt;
  string error;
  undefined8 local_90;
  string local_88;
  pthread_mutex_t *local_68;
  double local_60;
  double local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  __mutex = (pthread_mutex_t *)&this->dbMutex;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  iVar1 = open(this,(char *)&local_50,__oflag);
  if ((char)iVar1 == '\0') {
    Str_07.Length = 7;
    Str_07.Data = "error: ";
    prVar4 = llvm::raw_ostream::operator<<(os,Str_07);
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_88,this);
    prVar4 = (raw_ostream *)
             llvm::raw_ostream::write
                       (prVar4,(int)local_88._M_dataplus._M_p,(void *)local_88._M_string_length,
                        in_RCX);
    Str_08.Length = 1;
    Str_08.Data = "\n";
    llvm::raw_ostream::operator<<(prVar4,Str_08);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar1 = sqlite3_prepare_v2(this->db,"SELECT key, id FROM key_names;",0xffffffff,&local_90,0);
    if (iVar1 == 0) {
      Str.Length = 6;
      Str.Data = "keys:\n";
      local_68 = __mutex;
      llvm::raw_ostream::operator<<(os,Str);
      iVar1 = sqlite3_step(local_90);
      if (iVar1 == 100) {
        do {
          iVar1 = sqlite3_column_count(local_90);
          if (iVar1 != 2) {
            __assert_fail("sqlite3_column_count(stmt) == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                          ,0x33d,
                          "virtual void (anonymous namespace)::SQLiteBuildDB::dump(raw_ostream &)");
          }
          iVar1 = sqlite3_column_bytes(local_90,0);
          lVar2 = sqlite3_column_text(local_90,0);
          lVar3 = sqlite3_column_int64(local_90,1);
          prVar4 = llvm::raw_ostream::operator<<(os,lVar3);
          Str_00.Length = 4;
          Str_00.Data = " -- ";
          prVar4 = llvm::raw_ostream::operator<<(prVar4,Str_00);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,lVar2,iVar1 + lVar2);
          prVar4 = llvm::raw_ostream::operator<<(prVar4,local_88._M_dataplus._M_p);
          Str_01.Length = 1;
          Str_01.Data = "\n";
          llvm::raw_ostream::operator<<(prVar4,Str_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          iVar1 = sqlite3_step(local_90);
        } while (iVar1 == 100);
      }
      sqlite3_finalize(local_90);
      iVar1 = sqlite3_prepare_v2(this->db,
                                 "SELECT key_id, built_at, computed_at, start, end FROM rule_results;"
                                 ,0xffffffff,&local_90,0);
      __mutex = local_68;
      if (iVar1 == 0) {
        Str_02.Length = 10;
        Str_02.Data = "\nresults:\n";
        llvm::raw_ostream::operator<<(os,Str_02);
        iVar1 = sqlite3_step(local_90);
        while (iVar1 == 100) {
          iVar1 = sqlite3_column_count(local_90);
          if (iVar1 != 5) {
            __assert_fail("sqlite3_column_count(stmt) == 5",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                          ,0x351,
                          "virtual void (anonymous namespace)::SQLiteBuildDB::dump(raw_ostream &)");
          }
          lVar3 = sqlite3_column_int64(local_90,0);
          N = sqlite3_column_int64(local_90,1);
          N_00 = sqlite3_column_int64(local_90,2);
          local_58 = (double)sqlite3_column_double(local_90,3);
          local_60 = (double)sqlite3_column_double(local_90,4);
          prVar4 = llvm::raw_ostream::operator<<(os,lVar3);
          Str_03.Length = 4;
          Str_03.Data = " -- ";
          prVar4 = llvm::raw_ostream::operator<<(prVar4,Str_03);
          prVar4 = llvm::raw_ostream::operator<<(prVar4,N);
          Str_04.Length = 2;
          Str_04.Data = ", ";
          prVar4 = llvm::raw_ostream::operator<<(prVar4,Str_04);
          prVar4 = llvm::raw_ostream::operator<<(prVar4,N_00);
          Str_05.Length = 2;
          Str_05.Data = ", ";
          prVar4 = llvm::raw_ostream::operator<<(prVar4,Str_05);
          prVar4 = llvm::raw_ostream::operator<<(prVar4,local_60 - local_58);
          Str_06.Length = 2;
          Str_06.Data = "s\n";
          llvm::raw_ostream::operator<<(prVar4,Str_06);
          iVar1 = sqlite3_step(local_90);
        }
        sqlite3_finalize(local_90);
      }
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

virtual void dump(raw_ostream& os) override {
    std::lock_guard<std::mutex> guard(dbMutex);

    std::string error;
    if (!open(&error)) {
      os << "error: " << getCurrentErrorMessage() << "\n";
      return;
    }

    // Dump Keys
    int result;
    sqlite3_stmt* stmt;
    result = sqlite3_prepare_v2(db, "SELECT key, id FROM key_names;",
                                -1, &stmt, nullptr);
    if (result != SQLITE_OK)
      return;

    os << "keys:\n";
    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 2);

      auto size = sqlite3_column_bytes(stmt, 0);
      auto text = (const char*) sqlite3_column_text(stmt, 0);

      auto id = sqlite3_column_int64(stmt, 1);

      os << id << " -- " << KeyType(text, size).c_str() << "\n";
    }

    sqlite3_finalize(stmt);

    // Dump Keys
    result = sqlite3_prepare_v2(db, "SELECT key_id, built_at, computed_at, start, end FROM rule_results;",
                                -1, &stmt, nullptr);
    if (result != SQLITE_OK)
      return;

    os << "\nresults:\n";
    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 5);

      auto id = sqlite3_column_int64(stmt, 0);
      auto built = sqlite3_column_int64(stmt, 1);
      auto computed = sqlite3_column_int64(stmt, 2);
      auto start = sqlite3_column_double(stmt, 3);
      auto end = sqlite3_column_double(stmt, 4);

      os << id << " -- " << built << ", " << computed << ", " << end-start << "s\n";
    }

    sqlite3_finalize(stmt);
  }